

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inproc.c
# Opt level: O0

int inproc_ep_get_recvmaxsz(void *arg,void *v,size_t *szp,nni_opt_type t)

{
  int iVar1;
  int rv;
  inproc_ep *ep;
  nni_opt_type t_local;
  size_t *szp_local;
  void *v_local;
  void *arg_local;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0xa0));
  iVar1 = nni_copyout_size(*(size_t *)((long)arg + 0x98),v,szp,t);
  nni_mtx_unlock((nni_mtx *)((long)arg + 0xa0));
  return iVar1;
}

Assistant:

static int
inproc_ep_get_recvmaxsz(void *arg, void *v, size_t *szp, nni_opt_type t)
{
	inproc_ep *ep = arg;
	int        rv;
	nni_mtx_lock(&ep->mtx);
	rv = nni_copyout_size(ep->rcvmax, v, szp, t);
	nni_mtx_unlock(&ep->mtx);
	return (rv);
}